

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O0

ion_err_t linear_hash_update_bucket
                    (ion_fpos_t bucket_loc,linear_hash_bucket_t *bucket,
                    linear_hash_table_t *linear_hash)

{
  int iVar1;
  size_t sVar2;
  linear_hash_table_t *linear_hash_local;
  linear_hash_bucket_t *bucket_local;
  ion_fpos_t bucket_loc_local;
  
  if (linear_hash->database == (FILE *)0x0) {
    bucket_loc_local._7_1_ = '\t';
  }
  else {
    iVar1 = fseek((FILE *)linear_hash->database,bucket_loc,0);
    if (iVar1 == 0) {
      sVar2 = fwrite(bucket,0x10,1,(FILE *)linear_hash->database);
      if (sVar2 == 1) {
        bucket_loc_local._7_1_ = '\0';
      }
      else {
        bucket_loc_local._7_1_ = '\a';
      }
    }
    else {
      bucket_loc_local._7_1_ = '\r';
    }
  }
  return bucket_loc_local._7_1_;
}

Assistant:

ion_err_t
linear_hash_update_bucket(
	ion_fpos_t				bucket_loc,
	linear_hash_bucket_t	*bucket,
	linear_hash_table_t		*linear_hash
) {
	/* check the file is open */
	if (NULL == linear_hash->database) {
		return err_file_open_error;
	}

	/* seek to end of file to append new bucket */
	if (0 != fseek(linear_hash->database, bucket_loc, SEEK_SET)) {
		return err_file_bad_seek;
	}

	/* write bucket data to file */
	if (1 != fwrite(bucket, sizeof(linear_hash_bucket_t), 1, linear_hash->database)) {
		return err_file_write_error;
	}

	return err_ok;
}